

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O3

Maybe<unsigned_long> __thiscall
kj::HashIndex<kj::HashMap<capnp::Type,capnp::JsonCodec::HandlerBase*>::Callbacks>::
find<kj::HashMap<capnp::Type,capnp::JsonCodec::HandlerBase*>::Entry_const,capnp::StructSchema&>
          (HashIndex<kj::HashMap<capnp::Type,capnp::JsonCodec::HandlerBase*>::Callbacks> *this,
          ArrayPtr<const_kj::HashMap<capnp::Type,_capnp::JsonCodec::HandlerBase_*>::Entry> table,
          StructSchema *params)

{
  long lVar1;
  ulong uVar2;
  bool bVar3;
  uint uVar4;
  HandlerBase *pHVar5;
  int iVar6;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX_00;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar7;
  ulong uVar8;
  uint hash;
  Entry *pEVar9;
  uint64_t *in_R8;
  HandlerBase *pHVar10;
  Maybe<unsigned_long> MVar11;
  Type local_40;
  
  pEVar9 = table.ptr;
  lVar1._0_2_ = pEVar9[1].key.baseType;
  lVar1._2_1_ = pEVar9[1].key.listDepth;
  lVar1._3_1_ = pEVar9[1].key.isImplicitParam;
  lVar1._4_2_ = pEVar9[1].key.field_3;
  lVar1._6_2_ = *(undefined2 *)&pEVar9[1].key.field_0x6;
  aVar7.value = table.size_;
  if (lVar1 != 0) {
    hash = (uint)((int)(*in_R8 >> 0x20) * 0xbfe3 + (int)*in_R8 != 0);
    uVar4 = kj::_::chooseBucket(hash,(uint)lVar1);
    uVar8 = (ulong)uVar4;
    pHVar5 = pEVar9->value;
    iVar6 = *(int *)((long)&pHVar5[uVar8]._vptr_HandlerBase + 4);
    aVar7 = extraout_RDX;
    if (iVar6 != 0) {
      pHVar10 = pHVar5 + uVar8;
      do {
        if ((iVar6 != 1) && (*(uint *)&pHVar10->_vptr_HandlerBase == hash)) {
          local_40.field_4.scopeId = *in_R8;
          local_40.baseType = STRUCT;
          local_40.listDepth = '\0';
          bVar3 = capnp::Type::operator==
                            ((Type *)(table.size_ + (ulong)(iVar6 - 2) * 0x18),&local_40);
          aVar7 = extraout_RDX_00;
          if (bVar3) {
            iVar6 = *(int *)((long)&pHVar10->_vptr_HandlerBase + 4);
            *this = (HashIndex<kj::HashMap<capnp::Type,capnp::JsonCodec::HandlerBase*>::Callbacks>)
                    0x1;
            *(ulong *)(this + 8) = (ulong)(iVar6 - 2);
            goto LAB_001ec036;
          }
          pHVar5 = pEVar9->value;
        }
        uVar2._0_2_ = pEVar9[1].key.baseType;
        uVar2._2_1_ = pEVar9[1].key.listDepth;
        uVar2._3_1_ = pEVar9[1].key.isImplicitParam;
        uVar2._4_2_ = pEVar9[1].key.field_3;
        uVar2._6_2_ = *(undefined2 *)&pEVar9[1].key.field_0x6;
        if (uVar8 + 1 == uVar2) {
          uVar8 = 0;
        }
        else {
          uVar8 = uVar8 + 1 & 0xffffffff;
        }
        pHVar10 = pHVar5 + uVar8;
        iVar6 = *(int *)((long)&pHVar10->_vptr_HandlerBase + 4);
      } while (iVar6 != 0);
    }
  }
  *this = (HashIndex<kj::HashMap<capnp::Type,capnp::JsonCodec::HandlerBase*>::Callbacks>)0x0;
LAB_001ec036:
  MVar11.ptr.field_1.value = aVar7.value;
  MVar11.ptr._0_8_ = this;
  return (Maybe<unsigned_long>)MVar11.ptr;
}

Assistant:

Maybe<size_t> find(kj::ArrayPtr<Row> table, Params&&... params) const {
    if (buckets.size() == 0) return nullptr;

    uint hashCode = cb.hashCode(params...);
    for (uint i = _::chooseBucket(hashCode, buckets.size());; i = _::probeHash(buckets, i)) {
      auto& bucket = buckets[i];
      if (bucket.isEmpty()) {
        // not found.
        return nullptr;
      } else if (bucket.isErased()) {
        // skip, keep searching
      } else if (bucket.hash == hashCode &&
                 cb.matches(bucket.getRow(table), params...)) {
        // found
        return size_t(bucket.getPos());
      }
    }
  }